

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O3

bool __thiscall mkvmuxer::Segment::CheckHeaderInfo(Segment *this)

{
  uint uVar1;
  Track **ppTVar2;
  bool bVar3;
  int32_t count;
  uint64_t uVar4;
  long lVar5;
  uint uVar6;
  uint32_t *puVar7;
  uint64_t *puVar8;
  Track *pTVar9;
  
  bVar3 = true;
  if (this->header_written_ == false) {
    bVar3 = WriteSegmentHeader(this);
    if (bVar3) {
      uVar4 = MaxOffset(this);
      if ((this->seek_head_).seek_entry_id_[0] == 0) {
        (this->seek_head_).seek_entry_id_[0] = 0x1f43b675;
        puVar8 = (this->seek_head_).seek_entry_pos_;
      }
      else {
        puVar7 = (this->seek_head_).seek_entry_id_;
        lVar5 = 0;
        do {
          puVar7 = puVar7 + 1;
          if (lVar5 == -0x20) goto LAB_0012069e;
          lVar5 = lVar5 + -8;
        } while (*puVar7 != 0);
        *puVar7 = 0x1f43b675;
        puVar8 = (uint64_t *)((long)this + (0x38 - lVar5));
      }
      *puVar8 = uVar4;
      if (this->output_cues_ != true) {
        return true;
      }
      if (this->cues_track_ != 0) {
        return true;
      }
      uVar1 = (this->tracks_).track_entries_size_;
      if (uVar1 != 0) {
        ppTVar2 = (this->tracks_).track_entries_;
        uVar6 = 0;
        if (ppTVar2 != (Track **)0x0) {
          do {
            if (ppTVar2[uVar6] == (Track *)0x0) goto LAB_0012069e;
            uVar4 = ppTVar2[uVar6]->number_;
            pTVar9 = *ppTVar2;
            if (pTVar9->number_ != uVar4) {
              lVar5 = 1;
              do {
                pTVar9 = ppTVar2[lVar5];
                lVar5 = lVar5 + 1;
              } while (pTVar9->number_ != uVar4);
            }
            if (pTVar9->type_ == 1) {
              this->cues_track_ = uVar4;
              if (uVar4 != 0) {
                return true;
              }
              break;
            }
            uVar6 = uVar6 + 1;
          } while (uVar6 != uVar1);
          ppTVar2 = (this->tracks_).track_entries_;
          if ((ppTVar2 != (Track **)0x0) && (pTVar9 = *ppTVar2, pTVar9 != (Track *)0x0)) {
            this->cues_track_ = pTVar9->number_;
            return true;
          }
        }
      }
    }
LAB_0012069e:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool Segment::CheckHeaderInfo() {
  if (!header_written_) {
    if (!WriteSegmentHeader())
      return false;

    if (!seek_head_.AddSeekEntry(libwebm::kMkvCluster, MaxOffset()))
      return false;

    if (output_cues_ && cues_track_ == 0) {
      // Check for a video track
      for (uint32_t i = 0; i < tracks_.track_entries_size(); ++i) {
        const Track* const track = tracks_.GetTrackByIndex(i);
        if (!track)
          return false;

        if (tracks_.TrackIsVideo(track->number())) {
          cues_track_ = track->number();
          break;
        }
      }

      // Set first track found
      if (cues_track_ == 0) {
        const Track* const track = tracks_.GetTrackByIndex(0);
        if (!track)
          return false;

        cues_track_ = track->number();
      }
    }
  }
  return true;
}